

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

int wallet::TraceSqlCallback(uint code,void *context,void *param1,void *param2)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  Level level;
  void *category;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  char *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  void *pvVar4;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (code == 1) {
    pvVar4 = context;
    category = param1;
    iVar2 = sqlite3_stmt_readonly();
    level = (Level)pvVar4;
    if (iVar2 == 0) {
      pcVar3 = (char *)0x0;
    }
    else {
      category = param1;
      pcVar3 = (char *)sqlite3_expanded_sql();
    }
    bVar1 = ::LogAcceptCategory((LogFlags)category,level);
    if (bVar1) {
      (**(code **)(*context + 0x60))(&local_48,context);
      local_50 = pcVar3;
      if (pcVar3 == (char *)0x0) {
        local_50 = (char *)sqlite3_sql(param1);
      }
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
      ;
      source_file._M_len = 0x61;
      logging_function._M_str = "TraceSqlCallback";
      logging_function._M_len = 0x10;
      LogPrintFormatInternal<std::__cxx11::string,char_const*>
                (logging_function,source_file,0x37,WALLETDB,Trace,
                 (ConstevalFormatString<2U>)0xe0cc19,&local_48,&local_50);
      std::__cxx11::string::~string((string *)&local_48);
    }
    if (pcVar3 != (char *)0x0) {
      sqlite3_free(pcVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

static int TraceSqlCallback(unsigned code, void* context, void* param1, void* param2)
{
    auto* db = static_cast<SQLiteDatabase*>(context);
    if (code == SQLITE_TRACE_STMT) {
        auto* stmt = static_cast<sqlite3_stmt*>(param1);
        // To be conservative and avoid leaking potentially secret information
        // in the log file, only expand statements that query the database, not
        // statements that update the database.
        char* expanded{sqlite3_stmt_readonly(stmt) ? sqlite3_expanded_sql(stmt) : nullptr};
        LogTrace(BCLog::WALLETDB, "[%s] SQLite Statement: %s\n", db->Filename(), expanded ? expanded : sqlite3_sql(stmt));
        if (expanded) sqlite3_free(expanded);
    }
    return SQLITE_OK;
}